

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scl.c
# Opt level: O2

int Scl_CommandBuffer(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  Abc_Ntk_t *pAVar4;
  char *pcVar5;
  char *pcVar6;
  float fVar7;
  uint local_8c;
  uint local_88;
  uint local_84;
  uint local_80;
  uint local_7c;
  uint local_78;
  uint local_74;
  uint local_70;
  uint local_6c;
  SC_BusPars Pars;
  
  pAVar4 = Abc_FrameReadNtk(pAbc);
  Pars.fBufPis = 0;
  Pars.fUseWireLoads = 0;
  Pars.fVerbose = 0;
  Pars.fVeryVerbose = 0;
  if ((SC_Lib *)pAbc->pLibScl == (SC_Lib *)0x0) {
    local_8c = 100;
  }
  else {
    fVar7 = Abc_SclComputeAverageSlew((SC_Lib *)pAbc->pLibScl);
    local_8c = (uint)fVar7;
  }
  local_74 = 0;
  Extra_UtilGetoptReset();
  local_7c = 1;
  local_84 = 10;
  local_88 = 300;
  local_78 = 0;
  local_80 = 0;
  local_70 = 0;
  local_6c = 0;
LAB_003a7844:
  do {
    iVar1 = Extra_UtilGetopt(argc,argv,"GSNsbpcvwh");
    iVar3 = globalUtilOptind;
    switch(iVar1) {
    case 0x70:
      local_78 = local_78 ^ 1;
      goto LAB_003a7844;
    case 0x71:
    case 0x72:
    case 0x74:
    case 0x75:
      goto switchD_003a788a_caseD_71;
    case 0x73:
      local_74 = local_74 ^ 1;
      goto LAB_003a7844;
    case 0x76:
      local_70 = local_70 ^ 1;
      goto LAB_003a7844;
    case 0x77:
      local_6c = local_6c ^ 1;
      goto LAB_003a7844;
    }
    if (iVar1 == 0x47) {
      if (argc <= globalUtilOptind) {
        pcVar5 = "Command line switch \"-G\" should be followed by a positive integer.\n";
LAB_003a7a11:
        Abc_Print(-1,pcVar5);
        goto switchD_003a788a_caseD_71;
      }
      uVar2 = atoi(argv[globalUtilOptind]);
      local_88 = uVar2;
    }
    else if (iVar1 == 0x4e) {
      if (argc <= globalUtilOptind) {
        pcVar5 = "Command line switch \"-N\" should be followed by a positive integer.\n";
        goto LAB_003a7a11;
      }
      uVar2 = atoi(argv[globalUtilOptind]);
      local_84 = uVar2;
    }
    else {
      if (iVar1 != 0x53) {
        if (iVar1 == 0x62) {
          local_7c = local_7c ^ 1;
        }
        else {
          if (iVar1 != 99) {
            if (iVar1 == -1) {
              Pars.fVeryVerbose = local_6c;
              Pars.fVerbose = local_70;
              Pars.fUseWireLoads = local_80;
              Pars.fBufPis = local_78;
              Pars.fAddBufs = local_7c;
              Pars.fSizeOnly = local_74;
              Pars.nDegree = local_84;
              Pars.Slew = local_8c;
              Pars.GainRatio = local_88;
              if (pAVar4 == (Abc_Ntk_t *)0x0) {
                pcVar5 = "Empty network.\n";
              }
              else if (pAVar4->ntkType == ABC_NTK_LOGIC) {
                if ((local_74 == 0 && local_7c == 0) && (pAVar4->vPhases == (Vec_Int_t *)0x0)) {
                  pcVar5 = "Fanin phase information is not avaiable.\n";
                }
                else if ((pAbc->pLibScl == (void *)0x0) ||
                        (iVar3 = Abc_SclHasDelayInfo(pAbc->pLibScl), iVar3 == 0)) {
                  pcVar5 = "Library delay info is not available.\n";
                }
                else {
                  pAVar4 = Abc_SclBufferingPerform(pAVar4,(SC_Lib *)pAbc->pLibScl,&Pars);
                  if (pAVar4 != (Abc_Ntk_t *)0x0) {
                    Abc_FrameReplaceCurrentNetwork(pAbc,pAVar4);
                    return 0;
                  }
                  pcVar5 = "The command has failed.\n";
                }
              }
              else {
                pcVar5 = "This command can only be applied to a logic network.\n";
              }
              Abc_Print(-1,pcVar5);
              return 1;
            }
            goto switchD_003a788a_caseD_71;
          }
          local_80 = local_80 ^ 1;
        }
        goto LAB_003a7844;
      }
      if (argc <= globalUtilOptind) {
        pcVar5 = "Command line switch \"-S\" should be followed by a positive integer.\n";
        goto LAB_003a7a11;
      }
      uVar2 = atoi(argv[globalUtilOptind]);
      local_8c = uVar2;
    }
    globalUtilOptind = iVar3 + 1;
    if ((int)uVar2 < 0) {
switchD_003a788a_caseD_71:
      fwrite("usage: buffer [-GSN num] [-sbpcvwh]\n",0x24,1,(FILE *)pAbc->Err);
      fwrite("\t           performs buffering and sizing and mapped network\n",0x3d,1,
             (FILE *)pAbc->Err);
      fprintf((FILE *)pAbc->Err,"\t-G <num> : target gain percentage [default = %d]\n",
              (ulong)local_88);
      fprintf((FILE *)pAbc->Err,"\t-S <num> : target slew in pisoseconds [default = %d]\n",
              (ulong)local_8c);
      fprintf((FILE *)pAbc->Err,"\t-N <num> : the maximum fanout count [default = %d]\n",
              (ulong)local_84);
      pcVar6 = "yes";
      pcVar5 = "yes";
      if (local_74 == 0) {
        pcVar5 = "no";
      }
      fprintf((FILE *)pAbc->Err,"\t-s       : toggle performing only sizing [default = %s]\n",pcVar5
             );
      pcVar5 = "yes";
      if (local_7c == 0) {
        pcVar5 = "no";
      }
      fprintf((FILE *)pAbc->Err,
              "\t-b       : toggle using buffers instead of inverters [default = %s]\n",pcVar5);
      pcVar5 = "yes";
      if (local_78 == 0) {
        pcVar5 = "no";
      }
      fprintf((FILE *)pAbc->Err,"\t-p       : toggle buffering primary inputs [default = %s]\n",
              pcVar5);
      pcVar5 = "yes";
      if (local_80 == 0) {
        pcVar5 = "no";
      }
      fprintf((FILE *)pAbc->Err,"\t-c       : toggle using wire-loads if specified [default = %s]\n"
              ,pcVar5);
      pcVar5 = "yes";
      if (local_70 == 0) {
        pcVar5 = "no";
      }
      fprintf((FILE *)pAbc->Err,"\t-v       : toggle printing verbose information [default = %s]\n",
              pcVar5);
      if (local_6c == 0) {
        pcVar6 = "no";
      }
      fprintf((FILE *)pAbc->Err,
              "\t-w       : toggle printing more verbose information [default = %s]\n",pcVar6);
      fwrite("\t-h       : print the command usage\n",0x24,1,(FILE *)pAbc->Err);
      return 1;
    }
  } while( true );
}

Assistant:

int Scl_CommandBuffer( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    SC_BusPars Pars, * pPars = &Pars;
    Abc_Ntk_t * pNtkRes, * pNtk = Abc_FrameReadNtk(pAbc);
    int c;
    memset( pPars, 0, sizeof(SC_BusPars) );
    pPars->GainRatio     =  300;
    pPars->Slew          = pAbc->pLibScl ? Abc_SclComputeAverageSlew((SC_Lib *)pAbc->pLibScl) : 100;
    pPars->nDegree       =   10;
    pPars->fSizeOnly     =    0;
    pPars->fAddBufs      =    1;
    pPars->fBufPis       =    0;
    pPars->fUseWireLoads =    0;
    pPars->fVerbose      =    0;
    pPars->fVeryVerbose  =    0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "GSNsbpcvwh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'G':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-G\" should be followed by a positive integer.\n" );
                goto usage;
            }
            pPars->GainRatio = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->GainRatio < 0 ) 
                goto usage;
            break;
        case 'S':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-S\" should be followed by a positive integer.\n" );
                goto usage;
            }
            pPars->Slew = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->Slew < 0 ) 
                goto usage;
            break;
        case 'N':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-N\" should be followed by a positive integer.\n" );
                goto usage;
            }
            pPars->nDegree = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nDegree < 0 ) 
                goto usage;
            break;
        case 's':
            pPars->fSizeOnly ^= 1;
            break;
        case 'b':
            pPars->fAddBufs ^= 1;
            break;
        case 'p':
            pPars->fBufPis ^= 1;
            break;
        case 'c':
            pPars->fUseWireLoads ^= 1;
            break;
        case 'v':
            pPars->fVerbose ^= 1;
            break;
        case 'w':
            pPars->fVeryVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }

    if ( pNtk == NULL )
    {
        Abc_Print( -1, "Empty network.\n" );
        return 1;
    }
    if ( !Abc_NtkIsLogic(pNtk) )
    {
        Abc_Print( -1, "This command can only be applied to a logic network.\n" );
        return 1;
    }
    if ( !pPars->fSizeOnly && !pPars->fAddBufs && pNtk->vPhases == NULL )
    {
        Abc_Print( -1, "Fanin phase information is not avaiable.\n" );
        return 1;
    }
    if ( !pAbc->pLibScl || !Abc_SclHasDelayInfo(pAbc->pLibScl) )
    {
        Abc_Print( -1, "Library delay info is not available.\n" );
        return 1;
    }
    // modify the current network
    pNtkRes = Abc_SclBufferingPerform( pNtk, (SC_Lib *)pAbc->pLibScl, pPars );
    if ( pNtkRes == NULL )
    {
        Abc_Print( -1, "The command has failed.\n" );
        return 1;
    }
    // replace the current network
    Abc_FrameReplaceCurrentNetwork( pAbc, pNtkRes );
    return 0;

usage:
    fprintf( pAbc->Err, "usage: buffer [-GSN num] [-sbpcvwh]\n" );
    fprintf( pAbc->Err, "\t           performs buffering and sizing and mapped network\n" );
    fprintf( pAbc->Err, "\t-G <num> : target gain percentage [default = %d]\n", pPars->GainRatio );
    fprintf( pAbc->Err, "\t-S <num> : target slew in pisoseconds [default = %d]\n", pPars->Slew );
    fprintf( pAbc->Err, "\t-N <num> : the maximum fanout count [default = %d]\n", pPars->nDegree );
    fprintf( pAbc->Err, "\t-s       : toggle performing only sizing [default = %s]\n", pPars->fSizeOnly? "yes": "no" );
    fprintf( pAbc->Err, "\t-b       : toggle using buffers instead of inverters [default = %s]\n", pPars->fAddBufs? "yes": "no" );
    fprintf( pAbc->Err, "\t-p       : toggle buffering primary inputs [default = %s]\n", pPars->fBufPis? "yes": "no" );
    fprintf( pAbc->Err, "\t-c       : toggle using wire-loads if specified [default = %s]\n", pPars->fUseWireLoads? "yes": "no" );
    fprintf( pAbc->Err, "\t-v       : toggle printing verbose information [default = %s]\n", pPars->fVerbose? "yes": "no" );
    fprintf( pAbc->Err, "\t-w       : toggle printing more verbose information [default = %s]\n", pPars->fVeryVerbose? "yes": "no" );
    fprintf( pAbc->Err, "\t-h       : print the command usage\n");
    return 1;
}